

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTcGenTarg::CTcGenTarg(CTcGenTarg *this)

{
  CTcT3ExcEntry *pCVar1;
  char *pcVar2;
  CVmHashTable *this_00;
  undefined8 *puVar3;
  
  (this->exc_table_).exc_alloced_ = 0x400;
  pCVar1 = (CTcT3ExcEntry *)malloc(0x8000);
  (this->exc_table_).table_ = pCVar1;
  (this->exc_table_).exc_used_ = 0;
  (this->exc_table_).method_ofs_ = 0;
  (this->const_layout_).page_size_ = 0;
  (this->const_layout_).page_cnt_ = 0;
  (this->code_layout_).page_size_ = 0;
  (this->code_layout_).page_cnt_ = 0;
  this->last_op_ = 0xf2;
  this->second_last_op_ = 0xf2;
  this->max_str_len_ = 0;
  this->max_list_cnt_ = 0;
  this->max_bytecode_len_ = 0;
  this->meta_head_ = (tc_meta_entry *)0x0;
  *(undefined8 *)((long)&this->meta_head_ + 4) = 0;
  *(undefined8 *)((long)&this->meta_tail_ + 4) = 0;
  this->fnset_head_ = (tc_fnset_entry *)0x0;
  this->fnset_tail_ = (tc_fnset_entry *)0x0;
  this->fnset_cnt_ = 0;
  add_meta(this,"tads-object",0xb,(CTcSymMetaclass *)0x0);
  add_meta(this,"list",4,(CTcSymMetaclass *)0x0);
  add_meta(this,"dictionary2/030000",0x12,(CTcSymMetaclass *)0x0);
  add_meta(this,"grammar-production/030000",0x19,(CTcSymMetaclass *)0x0);
  add_meta(this,"vector",6,(CTcSymMetaclass *)0x0);
  add_meta(this,"anon-func-ptr",0xd,(CTcSymMetaclass *)0x0);
  add_meta(this,"int-class-mod/030000",0x14,(CTcSymMetaclass *)0x0);
  add_meta(this,"lookuptable/030003",0x12,(CTcSymMetaclass *)0x0);
  this->predef_meta_idx_[0] = 0;
  this->predef_meta_idx_[1] = 1;
  this->predef_meta_idx_[2] = 2;
  this->predef_meta_idx_[3] = 3;
  this->predef_meta_idx_[4] = 4;
  this->predef_meta_idx_[5] = 5;
  this->predef_meta_idx_[6] = 6;
  this->predef_meta_idx_[7] = 7;
  this->next_prop_ = 1;
  this->next_obj_ = 1;
  this->sort_buf_size_ = 0x1000;
  pcVar2 = (char *)malloc(0x1000);
  this->sort_buf_ = pcVar2;
  this->debug_line_head_ = (tct3_debug_line_page *)0x0;
  this->debug_line_tail_ = (tct3_debug_line_page *)0x0;
  this->debug_line_cnt_ = 0;
  this->field_0xd0 = this->field_0xd0 & 0xe0;
  this->debug_stack_level_ = 0;
  this->mminit_obj_ = 0;
  this_00 = (CVmHashTable *)operator_new(0x20);
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = &PTR__CVmHashFunc_00322898;
  CVmHashTable::init(this_00,(EVP_PKEY_CTX *)0x400);
  this->strtab_ = this_00;
  return;
}

Assistant:

CTcGenTarg::CTcGenTarg()
{
    int i;
    
    /* 
     *   we haven't written any instructions yet - fill the pipe with
     *   no-op instructions so that we don't think we can combine the
     *   first instruction with anything previous 
     */
    last_op_ = OPC_NOP;
    second_last_op_ = OPC_NOP;

    /* 
     *   we haven't seen any strings or lists yet - set the initial
     *   maximum lengths to zero 
     */
    max_str_len_ = 0;
    max_list_cnt_ = 0;

    /* we haven't generated any code yet */
    max_bytecode_len_ = 0;

    /* there are no metaclasses defined yet */
    meta_head_ = meta_tail_ = 0;
    meta_cnt_ = 0;

    /* no function sets defined yet */
    fnset_head_ = fnset_tail_ = 0;
    fnset_cnt_ = 0;

    /* 
     *   Add the built-in metaclass entries.  The order of these entries
     *   is fixed to match the TCT3_METAID_xxx constants - if this order
     *   changes, those constants must change to match.  
     */
    add_meta("tads-object");
    add_meta("list");
    add_meta("dictionary2/030000");
    add_meta("grammar-production/030000");
    add_meta("vector");
    add_meta("anon-func-ptr");
    add_meta("int-class-mod/030000");
    add_meta("lookuptable/030003");

    /*
     *   Set up the initial translation table for translating from our
     *   internal metaclass index values - TCT3_METAID_xxx - to the *actual*
     *   image file dependency index.  When we're compiling a program, these
     *   are simply in our own internal order - index N in our scheme is
     *   simply index N in the actual image file - because we get to lay out
     *   exactly what the dependency table looks like.  However, we need the
     *   translation table for when we're being used as part of the debugger
     *   - in those cases, we don't get to dictate the dependency table
     *   layout, because the image file (and thus the dependency table) might
     *   have been generated by a different version of the compiler.  In
     *   those cases, the image file loader will have to set up the
     *   translation information for us.  
     */
    for (i = 0 ; i <= TCT3_METAID_LAST ; ++i)
        predef_meta_idx_[i] = i;
    
    /* start at the first valid property ID */
    next_prop_ = 1;

    /* start at the first valid object ID */
    next_obj_ = 1;

    /* allocate an initial sort buffer */
    sort_buf_size_ = 4096;
    sort_buf_ = (char *)t3malloc(sort_buf_size_);

    /* not in a constructor */
    in_constructor_ = FALSE;

    /* not in an operator overload */
    in_op_overload_ = FALSE;

    /* no debug line record pointers yet */
    debug_line_cnt_ = 0;
    debug_line_head_ = debug_line_tail_ = 0;

    /* normal (static compiler, non-debug) evaluation mode */
    eval_for_dyn_ = FALSE;
    eval_for_debug_ = FALSE;
    speculative_ = FALSE;
    debug_stack_level_ = 0;

    /* no multi-method initializer object yet */
    mminit_obj_ = VM_INVALID_OBJ;

    /* create the string interning hash table */
    strtab_ = new CVmHashTable(1024, new CVmHashFuncCS(), TRUE);
}